

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O2

int read_navigation_record_values(ingest_info *info,char *line,int num_values,double *value)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)num_values;
  uVar6 = 0;
  uVar5 = 0;
  if (0 < num_values) {
    uVar5 = (ulong)(uint)num_values;
  }
  do {
    if (uVar5 == uVar6) {
      return 0;
    }
    uVar3 = (int)uVar6 + 1U & 3;
    if (uVar3 == 0) {
      lVar2 = ftell((FILE *)info->f);
      info->offset = lVar2;
      info->linenumber = info->linenumber + 1;
      iVar1 = get_line(info->f,line);
      if (iVar1 < 0) {
        return -1;
      }
      lVar2 = 0x50;
      if ((long)uVar7 < 4) {
        lVar2 = (long)((int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff)
                            % 4) * 0x13 + 4);
      }
      if (iVar1 < lVar2) {
        coda_set_error(-0x16,"record line length (%ld) too short (line: %ld, byte offset: %ld)",
                       (long)iVar1,info->linenumber,info->offset);
        return -1;
      }
    }
    uVar4 = (ulong)(uVar3 * 0x13);
    lVar2 = coda_ascii_parse_double(line + uVar4 + 4,0x13,value,0);
    value = value + 1;
    uVar7 = uVar7 - 1;
    uVar6 = uVar6 + 1;
    if (lVar2 < 0) {
      coda_add_error_message
                (" (line: %ld, byte offset: %ld)",info->linenumber,uVar4 + info->offset + 4);
      return -1;
    }
  } while( true );
}

Assistant:

static int read_navigation_record_values(ingest_info *info, char *line, int num_values, double *value)
{
    int i;

    for (i = 0; i < num_values; i++)
    {
        int index = (i + 1) % 4;

        if (index == 0)
        {
            long expected_line_length = 4 + 4 * 19;
            long linelength;

            /* read next line */
            info->offset = ftell(info->f);
            info->linenumber++;
            linelength = get_line(info->f, line);
            if (linelength < 0)
            {
                return -1;
            }
            if (num_values - i < 4)
            {
                expected_line_length = 4 + ((num_values - i) % 4) * 19;
            }
            if (linelength < expected_line_length)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "record line length (%ld) too short (line: %ld, byte offset: %ld)",
                               linelength, info->linenumber, info->offset);
                return -1;
            }
        }
        if (coda_ascii_parse_double(&line[4 + index * 19], 19, &value[i], 0) < 0)
        {
            coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset + 4 + index * 19);
            return -1;
        }
    }

    return 0;
}